

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

void __thiscall mjs::global_object_impl::popuplate_global(global_object_impl *this)

{
  version vVar1;
  gc_heap *num_bytes;
  bool bVar2;
  undefined8 *puVar3;
  object *this_00;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  value eo;
  gc_heap_ptr<mjs::function_object> throw_func;
  gc_heap_ptr<mjs::global_object> self;
  anon_class_8_1_8991fb9c add;
  wostringstream woss;
  undefined1 local_240 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_238;
  undefined1 local_218 [16];
  undefined1 local_208 [48];
  undefined1 local_1d8 [16];
  uint32_t local_1c8;
  global_object_impl *local_1c0;
  gc_heap_ptr_untyped local_1b8;
  undefined1 local_1a8 [16];
  code *local_198;
  ios_base local_138 [264];
  
  if ((this->super_global_object).super_object.prototype_.pos_ == 0) {
    local_1a8._0_8_ = (gc_heap *)0x0;
    local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
  }
  else {
    gc_heap::unsafe_create_from_position<mjs::object>
              ((gc_heap *)local_1a8,(uint32_t)(this->super_global_object).super_object.heap_);
  }
  (this->object_prototype_).pos_ = local_1a8._8_4_;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
  num_bytes = (this->super_global_object).super_object.heap_;
  self_ptr((global_object_impl *)local_208);
  (*(this->super_global_object).super_object._vptr_object[0x13])(local_218,this,"Function");
  (*(this->super_global_object).super_object._vptr_object[0xb])(&local_1b8,this);
  gc_heap::
  allocate_and_construct<mjs::function_object,mjs::gc_heap_ptr<mjs::global_object>,mjs::string,mjs::gc_heap_ptr<mjs::object>>
            ((gc_heap *)local_240,(size_t)num_bytes,(gc_heap_ptr<mjs::global_object> *)0x48,
             (string *)local_208,(gc_heap_ptr<mjs::object> *)local_218);
  local_1a8._0_8_ = local_240;
  local_1a8._8_4_ = local_238._0_4_;
  if (local_240 != (undefined1  [8])0x0) {
    gc_heap::attach((gc_heap *)local_240,(gc_heap_ptr_untyped *)local_1a8);
  }
  (this->function_prototype_).pos_ = local_1a8._8_4_;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_218);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
  local_1c0 = this;
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"Object",make_object_object,&this->object_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"Function",make_function_object,&this->function_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"Array",make_array_object,&this->array_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"String",make_string_object,&this->string_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"Boolean",make_boolean_object,&this->boolean_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"Number",make_number_object,&this->number_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"Math",anon_unknown_35::make_math_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"Date",make_date_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             &local_1c0,"console",anon_unknown_35::make_console_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  if (1 < (int)(this->super_global_object).version_) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &local_1c0,"JSON",make_json_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0)
    ;
  }
  if (0 < (int)(this->super_global_object).version_) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &local_1c0,"RegExp",make_regexp_object,&this->regexp_prototype_);
    uVar6 = 0;
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &local_1c0,"Error",make_error_object,
                 (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
    puVar5 = &native_error_types;
    do {
      if (uVar6 != *puVar5) {
        __assert_fail("native_error_types[i] == static_cast<native_error_type>(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x298,"void mjs::global_object_impl::popuplate_global()");
      }
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
      mjs::operator<<((wostream *)local_1a8,(native_error_type)uVar6);
      std::__cxx11::wstringbuf::str();
      local_218._0_8_ = local_208._8_8_;
      local_218._8_8_ = local_208._0_8_;
      (**(this->super_global_object).super_object._vptr_object)(local_240,this,local_218);
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_,CONCAT44(local_208._20_4_,local_208._16_4_) * 4 + 4)
        ;
      }
      if (local_240._0_4_ != object) {
LAB_00143418:
        __assert_fail("is_function(eo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29c,"void mjs::global_object_impl::popuplate_global()");
      }
      bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                        ((gc_heap_ptr_untyped *)&local_238.s_);
      if (!bVar2) goto LAB_00143418;
      if (local_240._0_4_ != object) goto LAB_00143437;
      puVar3 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_238.s_);
      local_218._0_8_ = (gc_heap *)0x9;
      local_218._8_8_ = L"prototype";
      (**(code **)*puVar3)((value *)local_208,puVar3,local_218);
      if (local_208._0_4_ != object) {
        __assert_fail("prototype.type() == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29e,"void mjs::global_object_impl::popuplate_global()");
      }
      this->error_prototype_[uVar6].pos_ = local_208._16_4_;
      value::destroy((value *)local_208);
      value::destroy((value *)local_240);
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 1;
    } while (uVar6 != 8);
  }
  local_240 = (undefined1  [8])0x6;
  local_238.n_ = 8.40866132757884e-318;
  (**(this->super_global_object).super_object._vptr_object)(local_1a8,this);
  if (local_1a8._0_4_ == object) {
    this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_1a8 + 8));
    local_208._0_8_ = (gc_heap *)0x9;
    local_208._8_8_ = L"prototype";
    bVar2 = object::can_put(this_00,(wstring_view *)local_208);
    if (!bVar2) {
      value::destroy((value *)local_1a8);
      self_ptr((global_object_impl *)local_208);
      vVar1 = (this->super_global_object).version_;
      local_218._0_8_ = (gc_heap *)0x3;
      local_218._8_8_ = "NaN";
      string::string((string *)local_240,(this->super_global_object).super_object.heap_,
                     (string_view *)local_218);
      uVar4 = (uint)(1 < (int)vVar1) + (uint)(0 < (int)vVar1) * 4 + 2;
      local_1a8._0_4_ = number;
      local_1a8._8_8_ = (_Invoker_type)0x7ff8000000000000;
      (*(this->super_global_object).super_object._vptr_object[1])
                (this,local_240,local_1a8,(ulong)uVar4);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      local_218._0_8_ = (gc_heap *)0x8;
      local_218._8_8_ = "Infinity";
      string::string((string *)local_240,(this->super_global_object).super_object.heap_,
                     (string_view *)local_218);
      local_1a8._0_4_ = 3;
      local_1a8._8_8_ = (_Invoker_type)0x7ff0000000000000;
      (*(this->super_global_object).super_object._vptr_object[1])
                (this,local_240,local_1a8,(ulong)uVar4);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      local_218._0_8_ = (gc_heap *)0x9;
      local_218._8_8_ = "undefined";
      string::string((string *)local_240,(this->super_global_object).super_object.heap_,
                     (string_view *)local_218);
      value::value((value *)local_1a8,(value *)&value::undefined);
      (*(this->super_global_object).super_object._vptr_object[1])
                (this,local_240,local_1a8,(ulong)uVar4);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      local_1a8._0_8_ = local_208._0_8_;
      local_1a8._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      local_240 = (undefined1  [8])(this->super_global_object).super_object.heap_;
      local_238._0_4_ = (this->super_global_object).version_;
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
                ((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_1a8,"parseInt",
                 (anon_class_16_2_fa5da7e4_for_f *)local_240,2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_1a8._0_8_ = local_208._0_8_;
      local_1a8._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
                ((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_1a8,"isNaN",
                 (anon_class_1_0_00000001_for_f *)local_240,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_1a8._0_8_ = local_208._0_8_;
      local_1a8._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_3_>
                ((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_1a8,"isFinite",
                 (anon_class_1_0_00000001_for_f *)local_240,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_1a8._0_8_ = local_208._0_8_;
      local_1a8._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      local_240 = (undefined1  [8])(this->super_global_object).super_object.heap_;
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_4_>
                ((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_1a8,"alert",
                 (anon_class_8_1_54a39808_for_f *)local_240,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_240 = (undefined1  [8])local_208._0_8_;
      local_238._0_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_240);
      }
      local_1a8._0_8_ = local_208._0_8_;
      local_1a8._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      local_198 = anon_unknown_35::parse_float;
      mjs::operator()((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_240,
                      "parseFloat",(anon_class_24_2_fd42193c_for_f *)local_1a8,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      local_240 = (undefined1  [8])local_208._0_8_;
      local_238._0_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_240);
      }
      local_1a8._0_8_ = local_208._0_8_;
      local_1a8._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      local_198 = anon_unknown_35::escape;
      mjs::operator()((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_240,"escape",
                      (anon_class_24_2_fd42193c_for_f *)local_1a8,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      local_240 = (undefined1  [8])local_208._0_8_;
      local_238._0_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_240);
      }
      local_1a8._0_8_ = local_208._0_8_;
      local_1a8._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      local_198 = anon_unknown_35::unescape;
      mjs::operator()((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_240,
                      "unescape",(anon_class_24_2_fd42193c_for_f *)local_1a8,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      if (0 < (int)(this->super_global_object).version_) {
        local_240 = (undefined1  [8])local_208._0_8_;
        local_238._0_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_240);
        }
        local_1a8._0_8_ = local_208._0_8_;
        local_1a8._8_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
        }
        local_198 = anon_unknown_35::encode_uri;
        mjs::operator()((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_240,
                        "encodeURI",(anon_class_24_2_fd42193c_for_f *)local_1a8,1);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
        local_240 = (undefined1  [8])local_208._0_8_;
        local_238._0_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_240);
        }
        local_1a8._0_8_ = local_208._0_8_;
        local_1a8._8_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
        }
        local_198 = anon_unknown_35::encode_uri_component;
        mjs::operator()((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_240,
                        "encodeURIComponent",(anon_class_24_2_fd42193c_for_f *)local_1a8,1);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
        local_240 = (undefined1  [8])local_208._0_8_;
        local_238._0_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_240);
        }
        local_1a8._0_8_ = local_208._0_8_;
        local_1a8._8_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
        }
        local_198 = anon_unknown_35::decode_uri;
        mjs::operator()((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_240,
                        "decodeURI",(anon_class_24_2_fd42193c_for_f *)local_1a8,1);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
        local_240 = (undefined1  [8])local_208._0_8_;
        local_238._0_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_240);
        }
        local_1a8._0_8_ = local_208._0_8_;
        local_1a8._8_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
        }
        local_198 = anon_unknown_35::decode_uri_component;
        mjs::operator()((gc_heap_ptr<mjs::global_object> *)local_208,(object_ptr *)local_240,
                        "decodeURIComponent",(anon_class_24_2_fd42193c_for_f *)local_1a8,1);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      }
      if (1 < (int)(this->super_global_object).version_) {
        local_1a8._0_8_ = local_208._0_8_;
        local_1a8._8_4_ = local_208._8_4_;
        if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_1a8);
        }
        (*(this->super_global_object).super_object._vptr_object[0x13])(local_240,this,"");
        make_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_5_>
                  ((mjs *)local_218,(gc_heap_ptr<mjs::global_object> *)local_208,
                   (anon_class_16_1_570cf4e1_for_f *)local_1a8,
                   (gc_heap_ptr<mjs::gc_string> *)local_240,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
        local_1d8._8_8_ = local_218._0_8_;
        local_1c8 = local_218._8_4_;
        if ((gc_heap *)local_218._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_218._0_8_,(gc_heap_ptr_untyped *)(local_1d8 + 8));
        }
        local_1a8._0_4_ = 5;
        local_1a8._8_8_ = local_1d8._8_8_;
        local_198 = (code *)CONCAT44(local_198._4_4_,local_1c8);
        if ((gc_heap *)local_1d8._8_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_1d8._8_8_,(gc_heap_ptr_untyped *)(local_1a8 + 8));
        }
        local_208._40_8_ = local_218._0_8_;
        local_1d8._0_4_ = local_218._8_4_;
        if ((gc_heap *)local_218._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_218._0_8_,(gc_heap_ptr_untyped *)(local_208 + 0x28));
        }
        local_240._0_4_ = 5;
        local_238.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_208._40_8_;
        local_238.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
             local_1d8._0_4_;
        if ((gc_heap *)local_208._40_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_208._40_8_,(gc_heap_ptr_untyped *)&local_238.s_);
        }
        make_accessor_object
                  ((mjs *)&local_1b8,(gc_heap_ptr<mjs::global_object> *)local_208,(value *)local_1a8
                   ,(value *)local_240);
        (this->thrower_).pos_ = local_1b8.pos_;
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1b8);
        value::destroy((value *)local_240);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_208 + 0x28));
        value::destroy((value *)local_1a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_1d8 + 8));
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_218);
      }
      (*(this->super_global_object).super_object._vptr_object[0x13])(local_240,this,"global");
      local_218._0_8_ = local_208._0_8_;
      local_218._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_218);
      }
      local_1a8._0_4_ = 5;
      local_1a8._8_8_ = local_218._0_8_;
      local_198 = (code *)CONCAT44(local_198._4_4_,local_218._8_4_);
      if ((gc_heap *)local_218._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_218._0_8_,(gc_heap_ptr_untyped *)(local_1a8 + 8));
      }
      (*(this->super_global_object).super_object._vptr_object[1])(this,local_240,local_1a8,5);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_218);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      (*(this->super_global_object).super_object._vptr_object[0x13])(local_240,this,"this");
      local_218._0_8_ = local_208._0_8_;
      local_218._8_4_ = local_208._8_4_;
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_208._0_8_,(gc_heap_ptr_untyped *)local_218);
      }
      local_1a8._0_4_ = object;
      local_1a8._8_8_ = local_218._0_8_;
      local_198 = (code *)CONCAT44(local_198._4_4_,local_218._8_4_);
      if ((gc_heap *)local_218._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_218._0_8_,(gc_heap_ptr_untyped *)(local_1a8 + 8));
      }
      (*(this->super_global_object).super_object._vptr_object[1])(this,local_240,local_1a8,7);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_218);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      (*(this->super_global_object).super_object._vptr_object[0x13])(local_240,this,"length");
      local_1a8._0_4_ = 3;
      local_1a8._8_8_ = (_Invoker_type)0x0;
      (*(this->super_global_object).super_object._vptr_object[1])(this,local_240,local_1a8,7);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_240);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
      return;
    }
    __assert_fail("!get(L\"Object\").object_value()->can_put(L\"prototype\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                  ,0x2a3,"void mjs::global_object_impl::popuplate_global()");
  }
LAB_00143437:
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

void popuplate_global() {
        // The object and function prototypes are special
        object_prototype_   = prototype(); // This way the global object will have the same functions as a normal object
        function_prototype_ = static_cast<object_ptr>(heap().make<function_object>(self_ptr(), common_string("Function"), object_prototype()));
         
        auto add = [&](const char* name, auto create_func, gc_heap_ptr_untracked<object>* prototype = nullptr) {
            auto res = create_func(self_ptr());
            put(common_string(name), value{res.obj}, default_attributes);
            if (res.prototype) {
                assert(res.obj.template has_type<function_object>());
                auto& f = static_cast<function_object&>(*res.obj);
                f.put_prototype_with_attributes(res.prototype, prototype_attributes);
            }
            if (prototype) {
                assert(res.prototype);
                *prototype = res.prototype;
            }
        };

        // §15.1
        add("Object", make_object_object, &object_prototype_);          // Resetting it..
        add("Function", make_function_object, &function_prototype_);    // same
        add("Array", make_array_object, &array_prototype_);
        add("String", make_string_object, &string_prototype_);
        add("Boolean", make_boolean_object, &boolean_prototype_);
        add("Number", make_number_object, &number_prototype_);
        add("Math", make_math_object);
        add("Date", make_date_object);
        add("console", make_console_object);
        if (version_ >= version::es5) {
            add("JSON", make_json_object);
        }

        if (language_version() >= version::es3) {
            add("RegExp", make_regexp_object, &regexp_prototype_);
            add("Error", make_error_object);

            // Grab error protototypes before the user can corrupt them
            for (uint32_t i = 0; i < num_native_error_types; ++i) {
                assert(native_error_types[i] == static_cast<native_error_type>(i));
                std::wostringstream woss;
                woss << static_cast<native_error_type>(i);
                auto eo = get(woss.str());
                assert(is_function(eo));
                auto prototype = eo.object_value()->get(L"prototype");
                assert(prototype.type() == value_type::object);
                error_prototype_[i] = prototype.object_value();
            }
        }

        assert(!get(L"Object").object_value()->can_put(L"prototype"));

        auto self = self_ptr();

        auto global_const_attrs = default_attributes;
        if (version_ >= version::es3) {
            global_const_attrs |= property_attribute::dont_delete;
        }
        if (version_ >= version::es5) {
            global_const_attrs |= property_attribute::read_only;
        }

        put(string{heap(), "NaN"}, value{NAN}, global_const_attrs);
        put(string{heap(), "Infinity"}, value{INFINITY}, global_const_attrs);
        put(string{heap(), "undefined"}, value{value::undefined}, global_const_attrs);

        // Note: eval is added by the interpreter

        put_native_function(self, self, "parseInt", [&h=heap(), ver=version_](const value&, const std::vector<value>& args) {
            const auto input = to_string(h, get_arg(args, 0));
            int radix = to_int32(get_arg(args, 1));
            return value{parse_int(input.view(), radix, ver)};
        }, 2);
        put_native_function(self, self, "isNaN", [](const value&, const std::vector<value>& args) {
            return value(std::isnan(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "isFinite", [](const value&, const std::vector<value>& args) {
            return value(std::isfinite(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "alert", [&h=heap()](const value&, const std::vector<value>& args) {
            std::wcout << "ALERT";
            for (auto& a: args) {
                std::wcout << "\t" << to_string(h, a);
            }
            std::wcout << "\n";
            return value::undefined;
        }, 1);

        auto put_string_function = [&](const char* name, auto f) {
            put_native_function(self, self, name, [self, f](const value&, const std::vector<value>& args) {
                const auto input = to_string(self.heap(), get_arg(args, 0));
                return f(self, input.view());
            }, 1);
        };

        put_string_function("parseFloat", &parse_float);
        put_string_function("escape", &escape);
        put_string_function("unescape", &unescape);

        if (version_ >= version::es3) {
            put_string_function("encodeURI", &encode_uri);
            put_string_function("encodeURIComponent", &encode_uri_component);
            put_string_function("decodeURI", &decode_uri);
            put_string_function("decodeURIComponent", &decode_uri_component);
        }

        if (version_ >= version::es5) {
            // ES5.1, 13.2.3 [[ThrowTypeError]]
            auto throw_func = make_function(self, [global = self](const value&, const std::vector<value>&) -> value {
                // For now only strict mode code uses this...
                throw native_error_exception{native_error_type::type, global->stack_trace(), "Property may not be accessed in strict mode"};
            }, common_string("").unsafe_raw_get(), 0);
            thrower_ = make_accessor_object(self, value{throw_func}, value{throw_func});

        }

        // Add this class as the global object
        put(common_string("global"), value{self}, property_attribute::dont_delete | property_attribute::read_only);

        put(common_string("this"), value{self}, prototype_attributes);

        // Make ES5 Conformance Suite happy
        put(common_string("length"), value{0.}, prototype_attributes);
    }